

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[12]>
          (String *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char *op,
          char (*rhs) [12])

{
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  StringMakerBase<true>::convert<std::__cxx11::string>(&local_48,(StringMakerBase<true> *)this,lhs);
  String::String(&local_60,(char *)lhs);
  String::operator+(&local_30,&local_48,&local_60);
  StringMakerBase<true>::convert<char[12]>(&SStack_78,(char (*) [12])op);
  String::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }